

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isobusfs_cmn.c
# Opt level: O0

int isobusfs_cmn_configure_error_queue(int sock)

{
  uint __errnum;
  int sock_00;
  int *piVar1;
  char *pcVar2;
  int in_EDI;
  int ret;
  int err_queue;
  uint uVar3;
  undefined4 local_c [2];
  uint local_4;
  
  local_c[0] = 1;
  sock_00 = setsockopt(in_EDI,0x6b,4,local_c,4);
  if (sock_00 < 0) {
    piVar1 = __errno_location();
    __errnum = -*piVar1;
    uVar3 = __errnum;
    pcVar2 = strerror(__errnum);
    isobusfs_log(LOG_LEVEL_ERROR,"set recverr: %d (%s)",(ulong)__errnum,pcVar2);
    local_4 = uVar3;
  }
  else {
    local_4 = isobusfs_cmn_configure_timestamping(sock_00);
    if (-1 < (int)local_4) {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int isobusfs_cmn_configure_error_queue(int sock)
{
	int err_queue = true;
	int ret;

	ret = setsockopt(sock, SOL_CAN_J1939, SO_J1939_ERRQUEUE,
			 &err_queue, sizeof(err_queue));
	if (ret < 0) {
		ret = -errno;
		pr_err("set recverr: %d (%s)", ret, strerror(ret));
		return ret;
	}

	ret = isobusfs_cmn_configure_timestamping(sock);
	if (ret < 0)
		return ret;

	return 0;
}